

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

intmatrix sptk::swipe::makeim(int xSz,int ySz)

{
  intmatrix iVar1;
  int **ppiVar2;
  int *piVar3;
  int in_ESI;
  int in_EDI;
  int i;
  intmatrix nw_matrix;
  int local_1c;
  
  ppiVar2 = (int **)malloc((long)in_EDI << 3);
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    piVar3 = (int *)malloc((long)in_ESI << 2);
    ppiVar2[local_1c] = piVar3;
  }
  iVar1.y = in_ESI;
  iVar1.x = in_EDI;
  iVar1.m = ppiVar2;
  return iVar1;
}

Assistant:

intmatrix makeim(int xSz, int ySz) {
    intmatrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(int) * xSz);
#else
    nw_matrix.m = (int**) malloc(sizeof(int*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = malloc(sizeof(int) * ySz);
#else
        nw_matrix.m[i] = (int*) malloc(sizeof(int) * ySz);
#endif
    return(nw_matrix);
}